

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xio.c
# Opt level: O1

void * xio_CloneOption(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  OPTIONHANDLER_HANDLE pOVar3;
  char *pcVar4;
  
  if (name == (char *)0x0 || value == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (void *)0x0;
    }
    pcVar4 = "invalid argument detected: const char* name=%p, const void* value=%p";
    iVar1 = 0xd6;
  }
  else {
    iVar1 = strcmp(name,"concreteOptions");
    if (iVar1 == 0) {
      pOVar3 = OptionHandler_Clone((OPTIONHANDLER_HANDLE)value);
      return pOVar3;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (void *)0x0;
    }
    pcVar4 = "unknown option: %s";
    iVar1 = 0xe1;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/xio.c"
            ,"xio_CloneOption",iVar1,1,pcVar4,name);
  return (void *)0x0;
}

Assistant:

static void* xio_CloneOption(const char* name, const void* value)
{
    void *result;
    if (
        (name == NULL) ||
        (value == NULL)
        )
    {
        LogError("invalid argument detected: const char* name=%p, const void* value=%p", name, value);
        result = NULL;
    }
    else
    {
        if (strcmp(name, CONCRETE_OPTIONS) == 0)
        {
            result = (void*)OptionHandler_Clone((OPTIONHANDLER_HANDLE)value);
        }
        else
        {
            LogError("unknown option: %s", name);
            result = NULL;
        }
    }
    return result;
}